

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O2

void absl::lts_20250127::anon_unknown_0::EncodeResult<double>
               (CalculatedFloat *calculated,bool negative,Nonnull<absl::from_chars_result_*> result,
               Nonnull<double_*> value)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  
  iVar1 = calculated->exponent;
  if (iVar1 == 99999) {
    result->ec = result_out_of_range;
    if (negative) {
      dVar4 = -1.79769313486232e+308;
    }
    else {
      dVar4 = 1.79769313486232e+308;
    }
  }
  else {
    uVar2 = calculated->mantissa;
    if (iVar1 != -99999 && uVar2 != 0) {
      lVar3 = (ulong)negative << 0x3f;
      if (uVar2 >> 0x34 == 0) {
        if (iVar1 != -0x432) {
          __assert_fail("exponent == kMinNormalExponent",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/charconv.cc"
                        ,0xaa,
                        "static double absl::lts_20250127::(anonymous namespace)::FloatTraits<double>::Make(mantissa_t, int, bool)"
                       );
        }
      }
      else {
        lVar3 = lVar3 + ((ulong)(iVar1 + 0x433) << 0x34);
        uVar2 = uVar2 & 0xfffffffffffff;
      }
      *value = (double)(lVar3 + uVar2);
      return;
    }
    result->ec = result_out_of_range;
    if (negative) {
      dVar4 = -0.0;
    }
    else {
      dVar4 = 0.0;
    }
  }
  *value = dVar4;
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::Nonnull<absl::from_chars_result*> result,
                  absl::Nonnull<FloatType*> value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0 : 0.0;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}